

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_multi_noncentral_absolute_pose_sac.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  void *pvVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  double dVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  timeval tVar10;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  size_t in_stack_00000058;
  rotations_t *in_stack_00000060;
  translations_t *in_stack_00000068;
  rotation_t *in_stack_00000070;
  translation_t *in_stack_00000078;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_00000088;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  *in_stack_00000090;
  size_t j;
  size_t i_1;
  size_t i;
  size_t numberInliers;
  double in_stack_00000120;
  double ransac_time;
  timeval toc;
  timeval tic;
  shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
  absposeproblem_ptr;
  MultiRansac<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem> ransac;
  NoncentralAbsoluteMultiAdapter adapter;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  gt;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiBearingVectors;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiPoints;
  rotations_t camRotations;
  translations_t camOffsets;
  rotation_t rotation;
  translation_t position;
  int numberCameras;
  size_t pointsPerCam;
  double outlierFraction;
  double noise;
  MultiNoncentralAbsolutePoseSacProblem *__p;
  NoncentralAbsoluteMultiAdapter *this;
  rotation_t *in_stack_fffffffffffffb70;
  int iVar11;
  ostream *in_stack_fffffffffffffb78;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_fffffffffffffbb0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_fffffffffffffbb8;
  double in_stack_fffffffffffffbc0;
  rotations_t *in_stack_fffffffffffffbc8;
  undefined1 asCentral;
  adapter_t *in_stack_fffffffffffffbd0;
  MultiNoncentralAbsolutePoseSacProblem *in_stack_fffffffffffffbd8;
  rotations_t *in_stack_fffffffffffffbe8;
  translations_t *in_stack_fffffffffffffbf0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_fffffffffffffbf8;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *in_stack_fffffffffffffc00;
  NoncentralAbsoluteMultiAdapter *in_stack_fffffffffffffc08;
  timeval *__tv;
  ulong local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  ulong local_3a0;
  timeval local_370;
  timeval local_360 [2];
  undefined4 local_338;
  int local_334;
  MultiRansac<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
  *in_stack_fffffffffffffcd8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2a8 [3];
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *in_stack_fffffffffffffdb0;
  ostream *in_stack_fffffffffffffdb8;
  undefined1 local_148 [236];
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  int local_34;
  
  local_34 = 0;
  opengv::initializeRandomSeed();
  local_48 = 0x3fe0000000000000;
  local_50 = 0x3fb999999999999a;
  local_58 = 0x19;
  local_5c = 4;
  opengv::generateRandomTranslation(in_stack_fffffffffffffbc0);
  opengv::generateRandomRotation(in_stack_00000120);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x6f54f0);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0x6f54fd);
  opengv::generateRandomCameraSystem
            ((int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
             (translations_t *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  asCentral = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
            *)0x6f5532);
  __p = (MultiNoncentralAbsolutePoseSacProblem *)(local_148 + 0x18);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
            *)0x6f5547);
  this = (NoncentralAbsoluteMultiAdapter *)local_148;
  std::
  vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::vector((vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
            *)0x6f555c);
  opengv::generateMulti2D3DCorrespondences
            (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
             in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
             in_stack_00000088,in_stack_00000090);
  opengv::printExperimentCharacteristics
            ((translation_t *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,(double)this,
             (double)__p);
  iVar11 = (int)((ulong)in_stack_fffffffffffffb70 >> 0x20);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  opengv::absolute_pose::NoncentralAbsoluteMultiAdapter::NoncentralAbsoluteMultiAdapter
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
             in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
             *)in_stack_fffffffffffffb78);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
             *)in_stack_fffffffffffffb78);
  opengv::sac::
  MultiRansac<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>::
  MultiRansac((MultiRansac<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
               *)in_stack_fffffffffffffb78,iVar11,(double)this,(double)__p);
  operator_new(0x13f0);
  opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem::
  MultiNoncentralAbsolutePoseSacProblem
            (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,(bool)asCentral);
  std::shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>::
  shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem,void>
            ((shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
              *)this,__p);
  std::shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>::
  operator=((shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
             *)this,(shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
                     *)__p);
  dVar6 = sqrt(2.0);
  dVar6 = atan((dVar6 * 0.5) / 800.0);
  dVar6 = cos(dVar6);
  iVar11 = (int)((ulong)(1.0 - dVar6) >> 0x20);
  uVar7 = 0;
  local_338 = 0x32;
  gettimeofday(local_360,(__timezone_ptr_t)0x0);
  opengv::sac::
  MultiRansac<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>::
  computeModel(in_stack_fffffffffffffcd8,iVar11);
  __tv = &local_370;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  tVar10 = timeval_minus((timeval *)__tv,(timeval *)local_360);
  dVar6 = (double)tVar10.tv_sec;
  tVar10 = timeval_minus((timeval *)&local_370,(timeval *)local_360);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar6;
  auVar8._0_8_ = (double)tVar10.tv_usec;
  auVar8._8_8_ = uVar7;
  auVar8 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar8,auVar9);
  poVar1 = std::operator<<((ostream *)&std::cout,"the ransac results is: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ransac needed ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_334);
  std::operator<<(poVar1," iterations and ");
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,auVar8._0_8_);
  poVar1 = std::operator<<(poVar1," seconds");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_3a0 = 0;
  local_3a8 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(local_2a8);
    if (sVar3 <= local_3a8) break;
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](local_2a8,local_3a8);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
    local_3a0 = sVar3 + local_3a0;
    local_3a8 = local_3a8 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"the number of inliers is: ");
  std::ostream::operator<<(poVar1,local_3a0);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"the found inliers are: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_3b0 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(local_2a8);
    if (sVar3 <= local_3b0) break;
    local_3b8 = 0;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](local_2a8,local_3b0);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
      if (sVar3 <= local_3b8) break;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](local_2a8,local_3b0);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,local_3b8);
      in_stack_fffffffffffffb78 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar5);
      std::operator<<(in_stack_fffffffffffffb78," ");
      local_3b8 = local_3b8 + 1;
    }
    local_3b0 = local_3b0 + 1;
  }
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>::
  ~shared_ptr((shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
               *)0x6f5cd6);
  opengv::sac::
  MultiRansac<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>::
  ~MultiRansac((MultiRansac<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
                *)0x6f5ce3);
  opengv::absolute_pose::NoncentralAbsoluteMultiAdapter::~NoncentralAbsoluteMultiAdapter(this);
  std::
  vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::~vector((vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
             *)in_stack_fffffffffffffb78);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
             *)in_stack_fffffffffffffb78);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector((vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
             *)in_stack_fffffffffffffb78);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)in_stack_fffffffffffffb78);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_fffffffffffffb78);
  return local_34;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.5;
  double outlierFraction = 0.1;
  size_t pointsPerCam = 25;
  int numberCameras = 4;

  //create a random viewpoint pose
  translation_t position = generateRandomTranslation(2.0);
  rotation_t rotation = generateRandomRotation(0.5);

  //create a random camera-system
  translations_t camOffsets;
  rotations_t camRotations;
  generateRandomCameraSystem( numberCameras, camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  std::vector<std::shared_ptr<points_t> > multiPoints;
  std::vector<std::shared_ptr<bearingVectors_t> > multiBearingVectors;
  std::vector< std::shared_ptr<Eigen::MatrixXd> > gt;
  generateMulti2D3DCorrespondences(
      position, rotation, camOffsets, camRotations,
      pointsPerCam, noise, outlierFraction,
      multiPoints, multiBearingVectors, gt );

  //print the experiment characteristics
  printExperimentCharacteristics(
      position, rotation, noise, outlierFraction );

  //create a non-central absolute adapter
  absolute_pose::NoncentralAbsoluteMultiAdapter adapter(
      multiBearingVectors,
      multiPoints,
      camOffsets,
      camRotations );

  //Create a AbsolutePoseSacProblem and Ransac
  //The method is set to GP3P
  sac::MultiRansac<
      sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem> ransac;
  std::shared_ptr<
      sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem> absposeproblem_ptr(
      new sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem(
      adapter ));

  ransac.sac_model_ = absposeproblem_ptr;
  ransac.threshold_ = 1.0 - cos(atan(sqrt(2.0)*0.5/800.0));
  ransac.max_iterations_ = 50;

  //Run the experiment
  struct timeval tic;
  struct timeval toc;
  gettimeofday( &tic, 0 );
  ransac.computeModel();
  gettimeofday( &toc, 0 );
  double ransac_time = TIMETODOUBLE(timeval_minus(toc,tic));

  //print the results
  std::cout << "the ransac results is: " << std::endl;
  std::cout << ransac.model_coefficients_ << std::endl << std::endl;
  std::cout << "Ransac needed " << ransac.iterations_ << " iterations and ";
  std::cout << ransac_time << " seconds" << std::endl << std::endl;
  size_t numberInliers = 0;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
    numberInliers += ransac.inliers_[i].size();
  std::cout << "the number of inliers is: " << numberInliers;
  std::cout << std::endl << std::endl;
  std::cout << "the found inliers are: " << std::endl;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
  {
    for(size_t j = 0; j < ransac.inliers_[i].size(); j++)
      std::cout << ransac.inliers_[i][j] << " ";
  }
  std::cout << std::endl << std::endl;
}